

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall higan::Socket::Socket(Socket *this,int fd,InetAddress *address)

{
  this->fd_ = fd;
  InetAddress::InetAddress(&this->address_,address);
  SetKeepALive(this);
  return;
}

Assistant:

Socket::Socket(int fd, const InetAddress& address):
		fd_(fd),
		address_(address)
{
	SetKeepALive();
}